

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

int libwebvtt::Parser::ParseTimingsLine
              (string *line_ptr,size_type arrow_pos,Time *start_time,Time *stop_time,
              settings_t *settings)

{
  char cVar1;
  ulong uVar2;
  undefined1 *puVar3;
  char *pcVar4;
  char c;
  undefined1 *puStack_48;
  int e;
  size_type idx;
  string *line;
  settings_t *settings_local;
  Time *stop_time_local;
  Time *start_time_local;
  size_type arrow_pos_local;
  string *line_ptr_local;
  
  if (line_ptr == (string *)0x0) {
    line_ptr_local._4_4_ = -1;
  }
  else if ((arrow_pos == 0xffffffffffffffff) ||
          (idx = (size_type)line_ptr, line = (string *)settings,
          settings_local = (settings_t *)stop_time, stop_time_local = start_time,
          start_time_local = (Time *)arrow_pos, arrow_pos_local = (size_type)line_ptr,
          uVar2 = std::__cxx11::string::length(), uVar2 <= arrow_pos)) {
    line_ptr_local._4_4_ = -1;
  }
  else {
    puVar3 = (undefined1 *)std::__cxx11::string::operator[](idx);
    *puVar3 = 0;
    puStack_48 = (undefined1 *)0x0;
    line_ptr_local._4_4_ =
         ParseTime((string *)idx,(size_type *)&stack0xffffffffffffffb8,stop_time_local);
    if (line_ptr_local._4_4_ == 0) {
      while( true ) {
        pcVar4 = (char *)std::__cxx11::string::operator[](idx);
        cVar1 = *pcVar4;
        if (cVar1 == '\0') break;
        if ((cVar1 != ' ') && (cVar1 != '\t')) {
          return -1;
        }
        puStack_48 = (undefined1 *)((long)puStack_48 + 1);
      }
      std::__cxx11::string::push_back((char)idx);
      puStack_48 = (undefined1 *)((long)&start_time_local->hours + 3);
      line_ptr_local._4_4_ =
           ParseTime((string *)idx,(size_type *)&stack0xffffffffffffffb8,(Time *)settings_local);
      if ((line_ptr_local._4_4_ == 0) &&
         (line_ptr_local._4_4_ =
               ParseSettings((string *)idx,(size_type)puStack_48,(settings_t *)line),
         line_ptr_local._4_4_ == 0)) {
        line_ptr_local._4_4_ = 0;
      }
    }
  }
  return line_ptr_local._4_4_;
}

Assistant:

int Parser::ParseTimingsLine(std::string* line_ptr,
                             std::string::size_type arrow_pos, Time* start_time,
                             Time* stop_time, Cue::settings_t* settings) {
  if (line_ptr == NULL)
    return -1;

  std::string& line = *line_ptr;

  if (arrow_pos == std::string::npos || arrow_pos >= line.length())
    return -1;

  // Place a NUL character at the start of the arrow token, in
  // order to demarcate the start time from remainder of line.
  line[arrow_pos] = kNUL;
  std::string::size_type idx = 0;

  int e = ParseTime(line, &idx, start_time);
  if (e)  // error
    return e;

  // Detect any junk that follows the start time,
  // but precedes the arrow symbol.

  while (char c = line[idx]) {
    if (c != kSPACE && c != kTAB)
      return -1;
    ++idx;
  }

  // Place a NUL character at the end of the line,
  // so the scanner has a place to stop, and begin
  // the scan just beyond the arrow token.

  line.push_back(kNUL);
  idx = arrow_pos + 3;

  e = ParseTime(line, &idx, stop_time);
  if (e)  // error
    return e;

  e = ParseSettings(line, idx, settings);
  if (e)  // error
    return e;

  return 0;  // success
}